

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QSpanCollection::clear(QSpanCollection *this)

{
  QSpanCollection *pQVar1;
  
  for (pQVar1 = (QSpanCollection *)
                (this->spans).
                super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; pQVar1 != this;
      pQVar1 = (QSpanCollection *)
               (pQVar1->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    operator_delete((void *)(pQVar1->spans).
                            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                            ._M_impl._M_node._M_size,0x14);
  }
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
  std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::clear
            (&this->spans);
  return;
}

Assistant:

void QSpanCollection::clear()
{
    qDeleteAll(spans);
    index.clear();
    spans.clear();
}